

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WaveletTree.h
# Opt level: O2

void __thiscall bwtil::WaveletTree::WaveletTree(WaveletTree *this,string *text,bool verbose)

{
  bool bVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  ostream *poVar4;
  byte *pbVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  ulint i;
  ulong uVar7;
  ulong uVar8;
  ulint j;
  size_type __n;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  undefined1 auVar12 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  int local_60;
  allocator_type local_59;
  string *local_58;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> *local_50;
  vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_> local_48;
  undefined1 extraout_var [56];
  
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = &this->nodes;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = text;
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"  Building Wavelet tree");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  uVar6 = local_58->_M_string_length;
  uVar3 = 0;
  this->n = uVar6;
  this->sigma = 0;
  for (uVar7 = 0; uVar7 < uVar6; uVar7 = uVar7 + 1) {
    pbVar5 = (byte *)std::__cxx11::string::at((ulong)local_58);
    in_XMM1._8_8_ = extraout_XMM1_Qb;
    in_XMM1._0_8_ = extraout_XMM1_Qa;
    uVar3 = this->sigma;
    if (uVar3 < *pbVar5) {
      pbVar5 = (byte *)std::__cxx11::string::at((ulong)local_58);
      in_XMM1._8_8_ = extraout_XMM1_Qb_00;
      in_XMM1._0_8_ = extraout_XMM1_Qa_00;
      uVar3 = (uint)*pbVar5;
      this->sigma = uVar3;
    }
    uVar6 = this->n;
  }
  auVar2 = vcvtusi2sd_avx512f(in_XMM1,uVar3 + 1);
  this->sigma = uVar3 + 1;
  auVar12._0_8_ = log2(auVar2._0_8_);
  auVar12._8_56_ = extraout_var;
  auVar2 = vroundsd_avx(auVar12._0_16_,auVar12._0_16_,10);
  uVar3 = vcvttsd2usi_avx512f(auVar2);
  this->log_sigma = uVar3;
  __n = ~(-1L << ((ulong)uVar3 & 0x3f));
  this->number_of_nodes = __n;
  if (verbose) {
    poVar4 = std::operator<<((ostream *)&std::cout,"   Number of nodes = ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"   filling nodes ... ");
    std::endl<char,std::char_traits<char>>(poVar4);
    __n = this->number_of_nodes;
  }
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::vector
            (&local_48,__n,&local_59);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::_M_move_assign
            (local_50,&local_48);
  std::vector<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>::~vector
            (&local_48);
  uVar6 = this->n;
  uVar7 = 0;
  local_60 = -1;
  for (uVar9 = 0; uVar9 < uVar6; uVar9 = uVar9 + 1) {
    iVar10 = (int)uVar7;
    bVar1 = local_60 < iVar10;
    bVar11 = (int)((long)((ulong)(uint)(iVar10 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) % 10) == 0;
    if (bVar11 && bVar1) {
      local_60 = iVar10;
    }
    if ((bVar11 && bVar1) && verbose) {
      poVar4 = std::operator<<((ostream *)&std::cout,"   ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar10);
      poVar4 = std::operator<<(poVar4,"% done.");
      std::endl<char,std::char_traits<char>>(poVar4);
      local_60 = iVar10;
    }
    iVar10 = -1;
    uVar6 = 0;
    for (uVar7 = 0; uVar7 < this->log_sigma; uVar7 = uVar7 + 1) {
      pbVar5 = (byte *)std::__cxx11::string::at((ulong)local_58);
      uVar8 = uVar6 & 0xffffffff;
      uVar3 = 1 << (this->log_sigma + iVar10 & 0x1f) & (uint)*pbVar5;
      succinct_bitvector::push_back
                ((this->nodes).
                 super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8,uVar3 != 0);
      uVar6 = uVar8 * 2 + 1;
      if (uVar3 != 0) {
        uVar6 = uVar8 * 2 + 2;
      }
      iVar10 = iVar10 + -1;
    }
    uVar6 = this->n;
    uVar7 = (uVar9 * 100) / uVar6;
  }
  if (verbose) {
    poVar4 = std::operator<<((ostream *)&std::cout,"   Done.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return;
}

Assistant:

WaveletTree(const string &text, bool verbose=false){

		if (verbose) cout << "  Building Wavelet tree"<<endl;

		this->n = text.length();
		sigma = 0;

		for(ulint i=0;i<n;i++)
			if((uchar)text.at(i)>sigma)
				sigma = (uchar)text.at(i);

		sigma++;

		log_sigma = ceil(log2(sigma));

		number_of_nodes = ((ulint)1<<log_sigma)-1;

		if (verbose) cout << "   Number of nodes = "<< number_of_nodes << endl;

		if (verbose) cout << "   filling nodes ... " << endl;

		nodes = vector<succinct_bitvector>(number_of_nodes);

		uint node = root();

		int perc=0,last_perc=-1;

		for(ulint i=0;i<n;i++){

			if(perc>last_perc and perc%10==0){

				if (verbose) cout << "   " << perc << "% done." <<endl;
				last_perc=perc;

			}

			for(ulint j=0;j<log_sigma;j++){

				bool bit = bitInChar((uchar)text.at(i),j);

				nodes[node].push_back(bit);

				node = (bit?child1(node):child0(node));

			}

			node = root();

			perc = (100*i)/n;

		}

		if (verbose) cout << "   Done." << endl;

	}